

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::tenaryByComponent::call
          (tenaryByComponent *this,GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  GLuint x;
  GLuint y;
  GLuint y_00;
  uint uVar2;
  undefined8 uVar3;
  GLdouble third_arg;
  GLdouble second_arg;
  GLdouble first_arg;
  GLuint component;
  functionPointer p_function;
  GLuint component_step_2;
  GLuint component_step_1;
  GLuint component_step_0;
  GLuint n_components;
  GLuint n_components_2;
  GLuint n_components_1;
  GLuint n_components_0;
  GLdouble *p_arg;
  GLdouble *p_result;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  tenaryByComponent *this_local;
  
  x = GPUShaderFP64Test10::functionObject::getArgumentComponents((functionObject *)this,0);
  y = GPUShaderFP64Test10::functionObject::getArgumentComponents((functionObject *)this,1);
  y_00 = GPUShaderFP64Test10::functionObject::getArgumentComponents((functionObject *)this,2);
  uVar2 = de::max<unsigned_int>(x,y);
  uVar2 = de::max<unsigned_int>(uVar2,y_00);
  pcVar1 = (code *)(this->super_tenaryBase).super_functionObject.m_p_function;
  for (first_arg._4_4_ = 0; first_arg._4_4_ < uVar2; first_arg._4_4_ = first_arg._4_4_ + 1) {
    uVar3 = (*pcVar1)(*(undefined8 *)((long)argument_src + (ulong)(first_arg._4_4_ * (x != 1)) * 8),
                      *(undefined8 *)
                       ((long)argument_src + (ulong)(first_arg._4_4_ * (y != 1) + x) * 8),
                      *(undefined8 *)
                       ((long)argument_src + (ulong)(first_arg._4_4_ * (y_00 != 1) + x + y) * 8));
    *(undefined8 *)((long)result_dst + (ulong)first_arg._4_4_ * 8) = uVar3;
  }
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		glw::GLdouble*		 p_result = (glw::GLdouble*)result_dst;
		const glw::GLdouble* p_arg	= (const glw::GLdouble*)argument_src;

		const glw::GLuint n_components_0 = getArgumentComponents(0);
		const glw::GLuint n_components_1 = getArgumentComponents(1);
		const glw::GLuint n_components_2 = getArgumentComponents(2);
		const glw::GLuint n_components   = de::max(de::max(n_components_0, n_components_1), n_components_2);

		const glw::GLuint component_step_0 = (1 == n_components_0) ? 0 : 1;
		const glw::GLuint component_step_1 = (1 == n_components_1) ? 0 : 1;
		const glw::GLuint component_step_2 = (1 == n_components_2) ? 0 : 1;

		functionPointer p_function = (functionPointer)m_p_function;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const glw::GLdouble first_arg  = p_arg[component * component_step_0];
			const glw::GLdouble second_arg = p_arg[component * component_step_1 + n_components_0];
			const glw::GLdouble third_arg  = p_arg[component * component_step_2 + n_components_0 + n_components_1];

			p_result[component] = p_function(first_arg, second_arg, third_arg);
		}
	}